

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O3

void __thiscall
cp::cpgen::calcNextFootprint
          (cpgen *this,Vector3 *step_vector,double step_angle,Pose *ref_waist_pose,
          Pose *ref_land_pose)

{
  double *pdVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ActualDstType actualDst;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar22;
  undefined1 auVar21 [16];
  double dVar23;
  double dVar24;
  double dVar25;
  
  dVar4 = cos(step_angle * 0.5);
  dVar5 = sin(step_angle * 0.5);
  auVar2 = _DAT_0010a050;
  dVar10 = dVar5 * 0.0;
  dVar11 = dVar10 * 0.0;
  dVar8 = dVar11 - dVar5 * 0.0;
  auVar16._8_4_ = SUB84(dVar8,0);
  auVar16._0_8_ = dVar11 - dVar4 * 0.0;
  auVar16._12_4_ = (int)((ulong)dVar8 >> 0x20);
  auVar9 = ZEXT816(0x8000000000000000);
  dVar15 = SUB168(auVar16 ^ auVar9,0) + dVar5 * 0.0 + dVar10;
  dVar17 = SUB168(auVar16 ^ auVar9,8) + dVar4 * 0.0 + dVar10;
  dVar8 = dVar5 * 0.0 + dVar11;
  auVar19._8_4_ = SUB84(dVar8,0);
  auVar19._0_8_ = dVar4 * 0.0 + dVar11;
  auVar19._12_4_ = (int)((ulong)dVar8 >> 0x20);
  dVar18 = SUB168(auVar19 ^ _DAT_0010a050,0) + (dVar5 - dVar10 * 0.0);
  dVar20 = SUB168(auVar19 ^ _DAT_0010a050,8) + (dVar4 - dVar10 * 0.0);
  dVar4 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[0];
  dVar5 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[1];
  dVar8 = (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
          .m_storage.m_data.array[2];
  dVar10 = (ref_waist_pose->qq).m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3];
  dVar11 = dVar8 * dVar15 - dVar4 * dVar18;
  auVar13._8_4_ = SUB84(dVar11,0);
  auVar13._0_8_ = dVar8 * dVar17 - dVar4 * dVar20;
  auVar13._12_4_ = (int)((ulong)dVar11 >> 0x20);
  dVar12 = SUB168(auVar13 ^ auVar9,0) + dVar5 * dVar18 + dVar10 * dVar15;
  dVar14 = SUB168(auVar13 ^ auVar9,8) + dVar5 * dVar20 + dVar10 * dVar17;
  dVar6 = -(dVar4 * dVar15 + dVar8 * dVar18) + (dVar10 * dVar20 - dVar5 * dVar17);
  dVar17 = dVar4 * dVar17 + dVar8 * dVar20 + (dVar10 * dVar18 - dVar5 * dVar15);
  dVar4 = (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[0];
  dVar5 = (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar8 = (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  dVar10 = dVar12 * dVar5 - dVar4 * dVar14;
  dVar10 = dVar10 + dVar10;
  dVar5 = dVar8 * dVar14 - dVar5 * dVar17;
  dVar4 = dVar4 * dVar17 - dVar8 * dVar12;
  dVar5 = dVar5 + dVar5;
  dVar4 = dVar4 + dVar4;
  dVar20 = dVar5 * dVar6 +
           (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[0] + (dVar10 * dVar14 - dVar4 * dVar17) +
           (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[0];
  dVar22 = dVar4 * dVar6 +
           (step_vector->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
           m_data.array[1] + (dVar5 * dVar17 - dVar10 * dVar12) +
           (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
           m_storage.m_data.array[1];
  (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[0] = dVar20;
  (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[1] = dVar22;
  (ref_waist_pose->pp).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
  .array[2] = 0.0;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] = dVar12;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = dVar14;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[2] = dVar17;
  (ref_waist_pose->qq).m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[3] = dVar6;
  uVar3 = (ulong)*(uint *)(this + 0x8d8);
  dVar4 = *(double *)(this + uVar3 * 0x18 + 0x8f8);
  dVar5 = *(double *)(this + uVar3 * 0x18 + 0x8f8 + 8);
  dVar8 = *(double *)(this + uVar3 * 0x18 + 0x8f0 + 8);
  dVar23 = dVar12 * dVar4 - *(double *)(this + uVar3 * 0x18 + 0x8f0) * dVar14;
  dVar23 = dVar23 + dVar23;
  dVar24 = dVar5 * dVar14 - dVar4 * dVar17;
  dVar25 = *(double *)(this + uVar3 * 0x18 + 0x8f0) * dVar17 - dVar5 * dVar12;
  dVar24 = dVar24 + dVar24;
  dVar25 = dVar25 + dVar25;
  dVar4 = *(double *)(this + 0x940);
  dVar10 = *(double *)(this + 0x948);
  dVar11 = *(double *)(this + 0x950);
  dVar15 = *(double *)(this + 0x958);
  dVar18 = dVar17 * dVar4 - dVar12 * dVar11;
  auVar21._8_4_ = SUB84(dVar18,0);
  auVar21._0_8_ = dVar17 * dVar10 - dVar12 * dVar15;
  auVar21._12_4_ = (int)((ulong)dVar18 >> 0x20);
  dVar18 = dVar12 * dVar4 + dVar17 * dVar11;
  auVar7._8_4_ = SUB84(dVar18,0);
  auVar7._0_8_ = dVar12 * dVar10 + dVar17 * dVar15;
  auVar7._12_4_ = (int)((ulong)dVar18 >> 0x20);
  ref_land_pose[uVar3].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] =
       dVar6 * dVar24 + *(double *)(this + uVar3 * 0x18 + 0x8f0) +
       (dVar23 * dVar14 - dVar25 * dVar17) + dVar20;
  ref_land_pose[uVar3].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = dVar6 * dVar25 + dVar8 + (dVar24 * dVar17 - dVar23 * dVar12) + dVar22;
  ref_land_pose[uVar3].pp.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = dVar6 * dVar23 + dVar5 + (dVar25 * dVar12 - dVar24 * dVar14) + 0.0;
  ref_land_pose[uVar3].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[0] = SUB168(auVar21 ^ auVar9,0) + dVar14 * dVar11 + dVar4 * dVar6;
  ref_land_pose[uVar3].qq.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
  m_storage.m_data.array[1] = SUB168(auVar21 ^ auVar9,8) + dVar14 * dVar15 + dVar10 * dVar6;
  pdVar1 = ref_land_pose[uVar3].qq.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array + 2;
  *pdVar1 = SUB168(auVar7 ^ auVar2,0) + (dVar6 * dVar11 - dVar14 * dVar4);
  pdVar1[1] = SUB168(auVar7 ^ auVar2,8) + (dVar6 * dVar15 - dVar14 * dVar10);
  return;
}

Assistant:

void cpgen::calcNextFootprint(const Vector3& step_vector, double step_angle,
    Pose& ref_waist_pose, Pose ref_land_pose[]) {

  // calc next waist pose
  Quat waist_r = ref_waist_pose.q() * rpy2q(0.0, 0.0, step_angle);
  Vector3 waist_pos = ref_waist_pose.p() + waist_r * step_vector;
  waist_pos.z() = 0.0;
  ref_waist_pose.set(waist_pos, waist_r);

  // calc footprints
  Vector3 ref_land_pose_p = ref_waist_pose.p() +
                            ref_waist_pose.q() * dist_body2foot[swingleg];
  Quat ref_land_pose_q    = ref_waist_pose.q() * init_feet_pose[0].q();
  ref_land_pose[swingleg].set(ref_land_pose_p, ref_land_pose_q);
}